

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_samplers.cpp
# Opt level: O1

void __thiscall FSamplerManager::FSamplerManager(FSamplerManager *this)

{
  ulong uVar1;
  FString name;
  FString local_38;
  
  if (((byte)gl.flags & 0x10) != 0) {
    (*_ptrc_glGenSamplers)(7,this->mSamplers);
    SetTextureFilterMode(this);
    (*_ptrc_glSamplerParameteri)(this->mSamplers[5],0x2801,0x2600);
    (*_ptrc_glSamplerParameteri)(this->mSamplers[5],0x2800,0x2600);
    (*_ptrc_glSamplerParameterf)(this->mSamplers[5],0x84fe,1.0);
    (*_ptrc_glSamplerParameterf)(this->mSamplers[4],0x84fe,1.0);
    (*_ptrc_glSamplerParameterf)(this->mSamplers[6],0x84fe,1.0);
    (*_ptrc_glSamplerParameteri)(this->mSamplers[1],0x2802,0x812f);
    (*_ptrc_glSamplerParameteri)(this->mSamplers[2],0x2803,0x812f);
    (*_ptrc_glSamplerParameteri)(this->mSamplers[3],0x2802,0x812f);
    (*_ptrc_glSamplerParameteri)(this->mSamplers[3],0x2803,0x812f);
    (*_ptrc_glSamplerParameteri)(this->mSamplers[4],0x2802,0x812f);
    (*_ptrc_glSamplerParameteri)(this->mSamplers[4],0x2803,0x812f);
    uVar1 = 0;
    do {
      local_38.Chars = FString::NullString.Nothing;
      FString::NullString.RefCount = FString::NullString.RefCount + 1;
      FString::Format(&local_38,"mSamplers[%d]",uVar1 & 0xffffffff);
      FGLDebug::LabelObject(0x82e6,this->mSamplers[uVar1],&local_38);
      FString::~FString(&local_38);
      uVar1 = uVar1 + 1;
    } while (uVar1 != 7);
  }
  return;
}

Assistant:

FSamplerManager::FSamplerManager()
{
	if (gl.flags & RFL_SAMPLER_OBJECTS)
	{
		glGenSamplers(7, mSamplers);
		SetTextureFilterMode();
		glSamplerParameteri(mSamplers[5], GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glSamplerParameteri(mSamplers[5], GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glSamplerParameterf(mSamplers[5], GL_TEXTURE_MAX_ANISOTROPY_EXT, 1.f);
		glSamplerParameterf(mSamplers[4], GL_TEXTURE_MAX_ANISOTROPY_EXT, 1.f);
		glSamplerParameterf(mSamplers[6], GL_TEXTURE_MAX_ANISOTROPY_EXT, 1.f);

		glSamplerParameteri(mSamplers[1], GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
		glSamplerParameteri(mSamplers[2], GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
		glSamplerParameteri(mSamplers[3], GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
		glSamplerParameteri(mSamplers[3], GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
		glSamplerParameteri(mSamplers[4], GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
		glSamplerParameteri(mSamplers[4], GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);

		for (int i = 0; i < 7; i++)
		{
			FString name;
			name.Format("mSamplers[%d]", i);
			FGLDebug::LabelObject(GL_SAMPLER, mSamplers[i], name);
		}
	}

}